

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_encode_decode.hpp
# Opt level: O2

string * code_utils::url_encode(string *__return_storage_ptr__,string *value)

{
  byte __c;
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,value->_M_string_length);
  pcVar1 = (value->_M_dataplus)._M_p;
  sVar2 = value->_M_string_length;
  for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
    __c = pcVar1[sVar3];
    if (((((byte)(__c - 0x30) < 10) || ((byte)((__c & 0xdf) + 0xbf) < 0x1a)) || (__c - 0x2d < 2)) ||
       ((__c == 0x5f || (__c == 0x7e)))) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,__c);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"%",&local_91);
      std::operator+(&local_70,&local_90,"0123456789ABCDEF"[(byte)pcVar1[sVar3] >> 4]);
      std::operator+(&local_50,&local_70,"0123456789ABCDEF"[(byte)pcVar1[sVar3] & 0xf]);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline static std::string url_encode(const std::string &value) noexcept {
  static auto hex_chars = "0123456789ABCDEF";

  std::string result;
  result.reserve(value.size());  // Minimum size of result

  for (auto &chr : value) {
    if (!((chr >= '0' && chr <= '9') || (chr >= 'A' && chr <= 'Z') ||
          (chr >= 'a' && chr <= 'z') || chr == '-' || chr == '.' ||
          chr == '_' || chr == '~'))
      result += std::string("%") +
                hex_chars[static_cast<unsigned char>(chr) >> 4] +
                hex_chars[static_cast<unsigned char>(chr) & 15];
    else
      result += chr;
  }

  return result;
}